

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5IterSetOutputsTokendata(Fts5Iter *pIter)

{
  int iVar1;
  Fts5TokenDataIter *pT;
  Fts5Iter *pFVar2;
  Fts5Index *p;
  Fts5PoslistReader *pFVar3;
  int iVar4;
  ulong uVar5;
  Fts5PoslistReader *pFVar6;
  Fts5TokenDataMap *pFVar7;
  u8 *puVar8;
  ulong uVar9;
  uint nByte;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  long iRowid;
  long in_FS_OFFSET;
  i64 iPrev;
  i64 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pT = pIter->pTokenDataIter;
  (pIter->base).nData = 0;
  (pIter->base).pData = (u8 *)0x0;
  uVar9 = (ulong)(uint)pT->nIter;
  if (pT->nIter < 1) {
LAB_001dffcd:
    (pIter->base).bEof = '\x01';
  }
  else {
    uVar5 = 0;
    iVar11 = 0;
    uVar10 = 0;
    lVar14 = -0x8000000000000000;
    do {
      pFVar2 = pT->apIter[uVar5];
      iRowid = lVar14;
      if ((pFVar2->base).bEof == '\0') {
        iRowid = (pFVar2->base).iRowid;
        if ((iVar11 == 0) || (iRowid < lVar14)) {
          (pIter->base).pData = (pFVar2->base).pData;
          (pIter->base).nData = (pFVar2->base).nData;
          iVar11 = 1;
          uVar10 = uVar5 & 0xffffffff;
        }
        else {
          iVar11 = iVar11 + (uint)(iRowid == lVar14);
          iRowid = lVar14;
        }
      }
      uVar5 = uVar5 + 1;
      lVar14 = iRowid;
    } while (uVar9 != uVar5);
    if (iVar11 == 0) goto LAB_001dffcd;
    p = pIter->pIndex;
    iVar1 = p->pConfig->eDetail;
    (pIter->base).bEof = '\0';
    (pIter->base).iRowid = iRowid;
    if ((iVar11 == 1) && (iVar1 == 0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        fts5TokendataIterAppendMap(p,pT,(int)uVar10,0,iRowid,-1);
        return;
      }
      goto LAB_001e0273;
    }
    if ((1 < iVar11) && (iVar1 != 1)) {
      local_40 = 0;
      if (pT->aPoslistReader == (Fts5PoslistReader *)0x0) {
        pFVar6 = (Fts5PoslistReader *)sqlite3Fts5MallocZero(&p->rc,uVar9 * 0x24);
        pT->aPoslistReader = pFVar6;
        if (pFVar6 == (Fts5PoslistReader *)0x0) goto LAB_001dffd1;
        uVar9 = (ulong)pT->nIter;
        pT->aPoslistToIter = (int *)(pFVar6 + uVar9);
      }
      if ((int)uVar9 < 1) {
        uVar12 = 0;
        iVar13 = 0;
      }
      else {
        lVar14 = 0;
        iVar13 = 0;
        uVar12 = 0;
        do {
          pFVar2 = pT->apIter[lVar14];
          if (iRowid == (pFVar2->base).iRowid) {
            pT->aPoslistToIter[(int)uVar12] = (int)lVar14;
            puVar8 = (pFVar2->base).pData;
            iVar4 = (pFVar2->base).nData;
            pFVar3 = pT->aPoslistReader;
            pFVar6 = pFVar3 + (int)uVar12;
            pFVar6->a = (u8 *)0x0;
            pFVar6->n = 0;
            pFVar6->i = 0;
            pFVar6->bFlag = '\0';
            pFVar6->bEof = '\0';
            *(undefined6 *)&pFVar6->field_0x12 = 0;
            pFVar6->iPos = 0;
            pFVar6->a = puVar8;
            pFVar6->n = iVar4;
            iVar4 = sqlite3Fts5PoslistNext64(puVar8,iVar4,&pFVar6->i,&pFVar3[(int)uVar12].iPos);
            if (iVar4 != 0) {
              pFVar3[(int)uVar12].bEof = '\x01';
            }
            uVar12 = uVar12 + 1;
            iVar13 = iVar13 + (pFVar2->base).nData;
            uVar9 = (ulong)(uint)pT->nIter;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < (int)uVar9);
      }
      nByte = iVar13 + iVar11 * 10 + (pIter->poslist).n;
      if ((nByte <= (uint)(pIter->poslist).nSpace) ||
         (iVar11 = sqlite3Fts5BufferSize(&pIter->pIndex->rc,&pIter->poslist,nByte), iVar11 == 0)) {
        if ((iVar1 == 0) && (pT->nMapAlloc < pT->nMap + iVar13)) {
          iVar13 = pT->nMapAlloc + iVar13;
          pFVar7 = (Fts5TokenDataMap *)sqlite3_realloc(pT->aMap,iVar13 * 0x30);
          if (pFVar7 == (Fts5TokenDataMap *)0x0) {
            pIter->pIndex->rc = 7;
            goto LAB_001dffd1;
          }
          pT->aMap = pFVar7;
          pT->nMapAlloc = iVar13 * 2;
        }
        (pIter->poslist).n = 0;
        if (0 < (int)uVar12) {
          do {
            puVar8 = &pT->aPoslistReader->bEof;
            uVar5 = 0;
            lVar14 = 0x7fffffffffffffff;
            uVar9 = 0;
            do {
              if ((*puVar8 == '\0') && (*(long *)(puVar8 + 7) < lVar14)) {
                uVar9 = uVar5 & 0xffffffff;
                lVar14 = *(long *)(puVar8 + 7);
              }
              uVar5 = uVar5 + 1;
              puVar8 = puVar8 + 0x20;
            } while (uVar12 != uVar5);
            if (lVar14 == 0x7fffffffffffffff) break;
            iVar13 = (int)uVar9;
            sqlite3Fts5PoslistSafeAppend(&pIter->poslist,&local_40,lVar14);
            pFVar3 = pT->aPoslistReader;
            pFVar6 = pFVar3 + iVar13;
            iVar11 = sqlite3Fts5PoslistNext64(pFVar6->a,pFVar6->n,&pFVar6->i,&pFVar3[iVar13].iPos);
            if (iVar11 != 0) {
              pFVar3[iVar13].bEof = '\x01';
            }
            if (iVar1 == 0) {
              pFVar7 = pT->aMap;
              iVar11 = pT->nMap;
              pFVar7[iVar11].iPos = lVar14;
              pFVar7[iVar11].iIter = pT->aPoslistToIter[iVar13];
              pFVar7[iVar11].iRowid = iRowid;
              pT->nMap = iVar11 + 1;
            }
          } while (0 < (int)uVar12);
        }
        (pIter->base).pData = (pIter->poslist).p;
        (pIter->base).nData = (pIter->poslist).n;
      }
    }
  }
LAB_001dffd1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001e0273:
  __stack_chk_fail();
}

Assistant:

static void fts5IterSetOutputsTokendata(Fts5Iter *pIter){
  int ii;
  int nHit = 0;
  i64 iRowid = SMALLEST_INT64;
  int iMin = 0;

  Fts5TokenDataIter *pT = pIter->pTokenDataIter;

  pIter->base.nData = 0;
  pIter->base.pData = 0;

  for(ii=0; ii<pT->nIter; ii++){
    Fts5Iter *p = pT->apIter[ii];
    if( p->base.bEof==0 ){
      if( nHit==0 || p->base.iRowid<iRowid ){
        iRowid = p->base.iRowid;
        nHit = 1;
        pIter->base.pData = p->base.pData;
        pIter->base.nData = p->base.nData;
        iMin = ii;
      }else if( p->base.iRowid==iRowid ){
        nHit++;
      }
    }
  }

  if( nHit==0 ){
    pIter->base.bEof = 1;
  }else{
    int eDetail = pIter->pIndex->pConfig->eDetail;
    pIter->base.bEof = 0;
    pIter->base.iRowid = iRowid;

    if( nHit==1 && eDetail==FTS5_DETAIL_FULL ){
      fts5TokendataIterAppendMap(pIter->pIndex, pT, iMin, 0, iRowid, -1);
    }else
    if( nHit>1 && eDetail!=FTS5_DETAIL_NONE ){
      int nReader = 0;
      int nByte = 0;
      i64 iPrev = 0;

      /* Allocate array of iterators if they are not already allocated. */
      if( pT->aPoslistReader==0 ){
        pT->aPoslistReader = (Fts5PoslistReader*)sqlite3Fts5MallocZero(
            &pIter->pIndex->rc,
            pT->nIter * (sizeof(Fts5PoslistReader) + sizeof(int))
        );
        if( pT->aPoslistReader==0 ) return;
        pT->aPoslistToIter = (int*)&pT->aPoslistReader[pT->nIter];
      }

      /* Populate an iterator for each poslist that will be merged */
      for(ii=0; ii<pT->nIter; ii++){
        Fts5Iter *p = pT->apIter[ii];
        if( iRowid==p->base.iRowid ){
          pT->aPoslistToIter[nReader] = ii;
          sqlite3Fts5PoslistReaderInit(
              p->base.pData, p->base.nData, &pT->aPoslistReader[nReader++]
          );
          nByte += p->base.nData;
        }
      }

      /* Ensure the output buffer is large enough */
      if( fts5BufferGrow(&pIter->pIndex->rc, &pIter->poslist, nByte+nHit*10) ){
        return;
      }

      /* Ensure the token-mapping is large enough */
      if( eDetail==FTS5_DETAIL_FULL && pT->nMapAlloc<(pT->nMap + nByte) ){
        int nNew = (pT->nMapAlloc + nByte) * 2;
        Fts5TokenDataMap *aNew = (Fts5TokenDataMap*)sqlite3_realloc(
            pT->aMap, nNew*sizeof(Fts5TokenDataMap)
        );
        if( aNew==0 ){
          pIter->pIndex->rc = SQLITE_NOMEM;
          return;
        }
        pT->aMap = aNew;
        pT->nMapAlloc = nNew;
      }

      pIter->poslist.n = 0;

      while( 1 ){
        i64 iMinPos = LARGEST_INT64;

        /* Find smallest position */
        iMin = 0;
        for(ii=0; ii<nReader; ii++){
          Fts5PoslistReader *pReader = &pT->aPoslistReader[ii];
          if( pReader->bEof==0 ){
            if( pReader->iPos<iMinPos ){
              iMinPos = pReader->iPos;
              iMin = ii;
            }
          }
        }

        /* If all readers were at EOF, break out of the loop. */
        if( iMinPos==LARGEST_INT64 ) break;

        sqlite3Fts5PoslistSafeAppend(&pIter->poslist, &iPrev, iMinPos);
        sqlite3Fts5PoslistReaderNext(&pT->aPoslistReader[iMin]);

        if( eDetail==FTS5_DETAIL_FULL ){
          pT->aMap[pT->nMap].iPos = iMinPos;
          pT->aMap[pT->nMap].iIter = pT->aPoslistToIter[iMin];
          pT->aMap[pT->nMap].iRowid = iRowid;
          pT->nMap++;
        }
      }

      pIter->base.pData = pIter->poslist.p;
      pIter->base.nData = pIter->poslist.n;
    }
  }
}